

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void uECC_vli_bytesToNative(uECC_word_t *native,uint8_t *bytes,int num_bytes)

{
  ulong *puVar1;
  char cVar2;
  uint uVar3;
  
  uECC_vli_clear(native,(wordcount_t)((num_bytes + 7) / 8));
  for (cVar2 = '\0'; uVar3 = (uint)cVar2, (int)uVar3 < num_bytes; cVar2 = cVar2 + '\x01') {
    puVar1 = (ulong *)((long)native + (ulong)(~uVar3 + num_bytes & 0xfffffff8));
    *puVar1 = *puVar1 | (ulong)bytes[(int)uVar3] << ((char)(~uVar3 + num_bytes) * '\b' & 0x3fU);
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_bytesToNative(uECC_word_t *native,
                                         const uint8_t *bytes,
                                         int num_bytes) {
    wordcount_t i;
    uECC_vli_clear(native, (num_bytes + (uECC_WORD_SIZE - 1)) / uECC_WORD_SIZE);
    for (i = 0; i < num_bytes; ++i) {
        unsigned b = num_bytes - 1 - i;
        native[b / uECC_WORD_SIZE] |=
            (uECC_word_t)bytes[i] << (8 * (b % uECC_WORD_SIZE));
    }
}